

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O3

void __thiscall
amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit
          (GpuBndryFuncFab<PeleLMCCFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  Real RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CoordType CVar5;
  undefined8 uVar6;
  double *pdVar7;
  pointer pBVar8;
  ACParm *pAVar9;
  DataContainer *pDVar10;
  byte bVar11;
  int iVar12;
  Arena *pAVar13;
  undefined4 extraout_var;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  Real *pRVar21;
  GeometryData *pGVar22;
  long lVar23;
  ulong uVar24;
  int idim;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  byte bVar30;
  int iVar32;
  undefined1 auVar31 [16];
  PeleLMCCFillExtDir f_user;
  Box bndry;
  AsyncArray<amrex::BCRec,_0> bcr_aa;
  BCRec *local_2b0;
  uint local_258 [6];
  undefined4 local_240;
  Real local_238;
  Real RStack_230;
  ProbParm *local_228;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined4 local_218;
  undefined4 uStack_214;
  int iStack_210;
  undefined4 uStack_20c;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  GpuBndryFuncFab<PeleLMCCFillExtDir> *local_1d8;
  ulong local_1d0;
  undefined8 local_1c8;
  int local_1c0;
  Box local_1b8;
  AsyncArray<amrex::BCRec,_0> local_198;
  Real local_188;
  Real RStack_180;
  Real local_178;
  Real RStack_170;
  Real local_168;
  Real RStack_160;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined8 uStack_144;
  anon_class_256_9_e3cd3141 local_130;
  
  bVar30 = 0;
  iVar2 = (bx->bigend).vect[0];
  uVar14 = *(ulong *)(bx->smallend).vect;
  iVar25 = (int)(uVar14 >> 0x20);
  uVar6 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar12 = (int)uVar6;
  iVar32 = (int)((ulong)uVar6 >> 0x20);
  iVar3 = (bx->smallend).vect[2];
  local_1c8 = CONCAT44((iVar12 - iVar25) + 1,(iVar2 - (int)uVar14) + 1);
  local_1c0 = (iVar32 - iVar3) + 1;
  local_258[0] = (geom->domain).smallend.vect[0];
  local_200 = (ulong)local_258[0];
  local_258[1] = (geom->domain).smallend.vect[1];
  local_1e0 = (ulong)local_258[1];
  local_258[2] = (geom->domain).smallend.vect[2];
  local_1f8 = (ulong)local_258[2];
  uVar16 = (geom->domain).btype.itype;
  iVar29 = (~uVar16 & 1) + (geom->domain).bigend.vect[0];
  local_258[4] = (geom->domain).bigend.vect[1] + (uint)((uVar16 & 2) == 0);
  local_208 = (ulong)local_258[4];
  local_258[5] = (geom->domain).bigend.vect[2] + (uint)((uVar16 & 4) == 0);
  local_1d0 = (ulong)local_258[5];
  local_258[3] = iVar29;
  local_240 = 7;
  lVar26 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar26 + 0x19) == '\x01') {
      iVar4 = *(int *)((long)&local_1c8 + lVar26 * 4);
      local_258[lVar26] = local_258[lVar26] - iVar4;
      local_258[lVar26 + 3] = local_258[lVar26 + 3] + iVar4;
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 3);
  auVar31._0_4_ = -(uint)((int)local_258[4] < iVar12);
  auVar31._4_4_ = -(uint)((int)local_258[5] < iVar32);
  auVar31._8_4_ = -(uint)((int)uVar14 < (int)local_258[0]);
  auVar31._12_4_ = -(uint)(iVar25 < (int)local_258[1]);
  iVar25 = movmskps(3,auVar31);
  if (((iVar25 != 0) || ((int)local_258[3] < iVar2)) || (iVar3 < (int)local_258[2])) {
    pdVar7 = (dest->super_BaseFab<double>).dptr;
    iVar2 = (dest->super_BaseFab<double>).nvar;
    uVar16 = (dest->super_BaseFab<double>).domain.smallend.vect[0];
    local_1e8 = (ulong)uVar16;
    iVar3 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar23 = (long)(dest->super_BaseFab<double>).domain.smallend.vect[1];
    lVar27 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    iVar25 = (dest->super_BaseFab<double>).domain.bigend.vect[0];
    lVar20 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    lVar26 = ((long)iVar25 - (long)(int)uVar16) + 1;
    lVar28 = (lVar27 - lVar23) * lVar26;
    uVar24 = (ulong)(iVar25 + 1);
    local_168 = (geom->prob_domain).xhi[1];
    RStack_160 = (geom->prob_domain).xhi[2];
    local_178 = (geom->prob_domain).xlo[2];
    RStack_170 = (geom->prob_domain).xhi[0];
    local_188 = (geom->prob_domain).xlo[0];
    RStack_180 = (geom->prob_domain).xlo[1];
    uVar6 = *(undefined8 *)(geom->domain).bigend.vect;
    local_158 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_150 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_14c = (undefined4)uVar6;
    uStack_148 = (undefined4)((ulong)uVar6 >> 0x20);
    uStack_144 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_238 = (geom->super_CoordSys).dx[0];
    RStack_230 = (geom->super_CoordSys).dx[1];
    RVar1 = (geom->super_CoordSys).dx[2];
    bVar11 = (geom->super_CoordSys).field_0x51;
    uVar16 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    uVar17 = (uint)(byte)(geom->super_CoordSys).field_0x53;
    pBVar8 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start;
    CVar5 = (geom->super_CoordSys).c_sys;
    local_198.d_data = (BCRec *)0x0;
    local_198.h_data = (BCRec *)0x0;
    local_1d8 = this;
    if (numcomp == 0) {
      local_2b0 = (BCRec *)0x0;
      bVar15 = bVar11;
    }
    else {
      local_1f0 = uVar24;
      pAVar13 = The_Pinned_Arena();
      iVar25 = (*pAVar13->_vptr_Arena[2])(pAVar13,(long)numcomp * 0x18);
      local_2b0 = (BCRec *)CONCAT44(extraout_var,iVar25);
      local_198.h_data = local_2b0;
      memcpy(local_2b0,pBVar8 + bcomp,(long)numcomp * 0x18);
      uVar14 = (ulong)(uint)(bx->smallend).vect[0];
      uVar24 = local_1f0;
      bVar15 = (geom->super_CoordSys).field_0x51;
    }
    lVar18 = (lVar20 - iVar3) * lVar28;
    lVar23 = (lVar23 << 0x20) + local_1e8;
    lVar27 = (lVar27 << 0x20) + uVar24;
    local_228 = (local_1d8->m_user_f).lprobparm;
    pAVar9 = (local_1d8->m_user_f).lacparm;
    pDVar10 = (local_1d8->m_user_f).lpmfdata;
    uVar6 = *(undefined8 *)&(local_1d8->m_user_f).m_do_turbinflow;
    local_218 = SUB84(pDVar10,0);
    uStack_214 = (undefined4)((ulong)pDVar10 >> 0x20);
    iStack_210 = (int)uVar6;
    uStack_20c = (undefined4)((ulong)uVar6 >> 0x20);
    uStack_220 = SUB84(pAVar9,0);
    uStack_21c = (undefined4)((ulong)pAVar9 >> 0x20);
    uVar19 = (uint)bVar11;
    iVar25 = (int)lVar20;
    if (((bVar15 & 1) == 0) && (iVar12 = (int)local_200, (int)uVar14 < iVar12)) {
      local_1b8.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      local_1b8._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_1b8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      local_1b8.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_1b8.bigend.vect[0] = iVar12 + -1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar7;
      local_130.fab.jstride = lVar26;
      local_130.fab.kstride = lVar28;
      local_130.fab.nstride = lVar18;
      local_130.fab.begin._0_8_ = lVar23;
      local_130.fab.begin.z = iVar3;
      local_130.fab.end._0_8_ = lVar27;
      local_130.fab.end.z = iVar25;
      local_130.fab.ncomp = iVar2;
      local_130.dxhi = iVar12;
      uVar6 = *(undefined8 *)((long)&(local_1d8->m_user_f).lacparm + 4);
      local_130.f_user.lprobparm = (local_1d8->m_user_f).lprobparm;
      local_130.f_user.lacparm._0_4_ = SUB84((local_1d8->m_user_f).lacparm,0);
      local_130.f_user.lacparm._4_4_ = (undefined4)uVar6;
      local_130.f_user.lpmfdata._0_4_ = (undefined4)((ulong)uVar6 >> 0x20);
      local_130.f_user._20_8_ = *(undefined8 *)((long)&(local_1d8->m_user_f).lpmfdata + 4);
      pRVar21 = &local_188;
      pGVar22 = &local_130.geomdata;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar22->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar30 * -2 + 1;
        pGVar22 = (GeometryData *)((long)pGVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_130.geomdata.dx[0] = local_238;
      local_130.geomdata.dx[1] = RStack_230;
      local_130.bcr_p = local_2b0;
      local_130.orig_comp = orig_comp;
      local_130.geomdata.dx[2] = RVar1;
      local_130.geomdata.is_periodic[0] = uVar19;
      local_130.geomdata.is_periodic[1] = uVar16;
      local_130.geomdata.is_periodic[2] = uVar17;
      local_130.geomdata.coord = CVar5;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_1_>
                (&local_1b8,(anon_class_256_9_c1a331ff *)&local_130);
      bVar15 = (geom->super_CoordSys).field_0x51;
    }
    if (((bVar15 & 1) == 0) && (iVar29 < (bx->bigend).vect[0])) {
      uVar6 = *(undefined8 *)(bx->bigend).vect;
      local_1b8._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_1b8.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_1b8.bigend.vect[0] = (int)uVar6;
      local_1b8.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
      local_1b8.smallend.vect[1] = (int)((ulong)*(undefined8 *)(bx->smallend).vect >> 0x20);
      local_1b8.smallend.vect[0] = iVar29 + 1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar7;
      local_130.fab.jstride = lVar26;
      local_130.fab.kstride = lVar28;
      local_130.fab.nstride = lVar18;
      local_130.fab.begin._0_8_ = lVar23;
      local_130.fab.begin.z = iVar3;
      local_130.fab.end._0_8_ = lVar27;
      local_130.fab.end.z = iVar25;
      local_130.fab.ncomp = iVar2;
      local_130.dxhi = iVar29;
      local_130.f_user.lprobparm = local_228;
      local_130.f_user.lacparm._0_4_ = uStack_220;
      local_130.f_user.m_do_turbinflow = iStack_210;
      local_130.f_user.lpmfdata._4_4_ = uStack_214;
      local_130.f_user.lacparm._4_4_ = uStack_21c;
      local_130.f_user.lpmfdata._0_4_ = local_218;
      pRVar21 = &local_188;
      pGVar22 = &local_130.geomdata;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar22->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar30 * -2 + 1;
        pGVar22 = (GeometryData *)((long)pGVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_130.geomdata.dx[0] = local_238;
      local_130.geomdata.dx[1] = RStack_230;
      local_130.bcr_p = local_2b0;
      local_130.orig_comp = orig_comp;
      local_130.geomdata.dx[2] = RVar1;
      local_130.geomdata.is_periodic[0] = uVar19;
      local_130.geomdata.is_periodic[1] = uVar16;
      local_130.geomdata.is_periodic[2] = uVar17;
      local_130.geomdata.coord = CVar5;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_2_>
                (&local_1b8,&local_130);
    }
    uVar14 = local_1f8;
    bVar11 = (geom->super_CoordSys).field_0x52;
    if ((bVar11 == 0) && (iVar29 = (int)local_1e0, (bx->smallend).vect[1] < iVar29)) {
      local_1b8.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
      local_1b8._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_1b8.smallend.vect[2] = (int)uVar6;
      local_1b8.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
      local_1b8.bigend.vect[1] = iVar29 + -1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar7;
      local_130.fab.jstride = lVar26;
      local_130.fab.kstride = lVar28;
      local_130.fab.nstride = lVar18;
      local_130.fab.begin._0_8_ = lVar23;
      local_130.fab.begin.z = iVar3;
      local_130.fab.end._0_8_ = lVar27;
      local_130.fab.end.z = iVar25;
      local_130.fab.ncomp = iVar2;
      local_130.dxhi = iVar29;
      local_130.f_user.lprobparm = local_228;
      local_130.f_user.lacparm._0_4_ = uStack_220;
      local_130.f_user.m_do_turbinflow = iStack_210;
      local_130.f_user.lpmfdata._4_4_ = uStack_214;
      local_130.f_user.lacparm._4_4_ = uStack_21c;
      local_130.f_user.lpmfdata._0_4_ = local_218;
      pRVar21 = &local_188;
      pGVar22 = &local_130.geomdata;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar22->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar30 * -2 + 1;
        pGVar22 = (GeometryData *)((long)pGVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_130.geomdata.dx[0] = local_238;
      local_130.geomdata.dx[1] = RStack_230;
      local_130.bcr_p = local_2b0;
      local_130.orig_comp = orig_comp;
      local_130.geomdata.dx[2] = RVar1;
      local_130.geomdata.is_periodic[0] = uVar19;
      local_130.geomdata.is_periodic[1] = uVar16;
      local_130.geomdata.is_periodic[2] = uVar17;
      local_130.geomdata.coord = CVar5;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_3_>
                (&local_1b8,(anon_class_256_9_29845ede *)&local_130);
      bVar11 = (geom->super_CoordSys).field_0x52;
    }
    iVar29 = (int)uVar14;
    if (((bVar11 & 1) == 0) && (iVar12 = (int)local_208, iVar12 < (bx->bigend).vect[1])) {
      uVar6 = *(undefined8 *)(bx->bigend).vect;
      local_1b8._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_1b8.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      local_1b8.bigend.vect[0] = (int)uVar6;
      local_1b8.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
      local_1b8.smallend.vect[0] = (int)*(undefined8 *)(bx->smallend).vect;
      local_1b8.smallend.vect[1] = iVar12 + 1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar7;
      local_130.fab.jstride = lVar26;
      local_130.fab.kstride = lVar28;
      local_130.fab.nstride = lVar18;
      local_130.fab.begin._0_8_ = lVar23;
      local_130.fab.begin.z = iVar3;
      local_130.fab.end._0_8_ = lVar27;
      local_130.fab.end.z = iVar25;
      local_130.fab.ncomp = iVar2;
      local_130.dxhi = iVar12;
      local_130.f_user.lprobparm = local_228;
      local_130.f_user.lacparm._0_4_ = uStack_220;
      local_130.f_user.m_do_turbinflow = iStack_210;
      local_130.f_user.lpmfdata._4_4_ = uStack_214;
      local_130.f_user.lacparm._4_4_ = uStack_21c;
      local_130.f_user.lpmfdata._0_4_ = local_218;
      pRVar21 = &local_188;
      pGVar22 = &local_130.geomdata;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar22->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar30 * -2 + 1;
        pGVar22 = (GeometryData *)((long)pGVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_130.geomdata.dx[0] = local_238;
      local_130.geomdata.dx[1] = RStack_230;
      local_130.bcr_p = local_2b0;
      local_130.orig_comp = orig_comp;
      local_130.geomdata.dx[2] = RVar1;
      local_130.geomdata.is_periodic[0] = uVar19;
      local_130.geomdata.is_periodic[1] = uVar16;
      local_130.geomdata.is_periodic[2] = uVar17;
      local_130.geomdata.coord = CVar5;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_4_>
                (&local_1b8,(anon_class_256_9_4bae5e20 *)&local_130);
    }
    bVar11 = (geom->super_CoordSys).field_0x53;
    if ((bVar11 == 0) && ((bx->smallend).vect[2] < iVar29)) {
      local_1b8.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar6 = *(undefined8 *)((bx->smallend).vect + 2);
      local_1b8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      local_1b8.smallend.vect[2] = (int)uVar6;
      local_1b8.bigend.vect[0] = (int)((ulong)uVar6 >> 0x20);
      local_1b8.btype.itype = (uint)((ulong)*(undefined8 *)((bx->bigend).vect + 2) >> 0x20);
      local_1b8.bigend.vect[2] = iVar29 + -1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar7;
      local_130.fab.jstride = lVar26;
      local_130.fab.kstride = lVar28;
      local_130.fab.nstride = lVar18;
      local_130.fab.begin._0_8_ = lVar23;
      local_130.fab.begin.z = iVar3;
      local_130.fab.end._0_8_ = lVar27;
      local_130.fab.end.z = iVar25;
      local_130.fab.ncomp = iVar2;
      local_130.dxhi = iVar29;
      local_130.f_user.lprobparm = local_228;
      local_130.f_user.lacparm._0_4_ = uStack_220;
      local_130.f_user.m_do_turbinflow = iStack_210;
      local_130.f_user.lpmfdata._4_4_ = uStack_214;
      local_130.f_user.lacparm._4_4_ = uStack_21c;
      local_130.f_user.lpmfdata._0_4_ = local_218;
      pRVar21 = &local_188;
      pGVar22 = &local_130.geomdata;
      for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar22->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar30 * -2 + 1;
        pGVar22 = (GeometryData *)((long)pGVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_130.geomdata.dx[0] = local_238;
      local_130.geomdata.dx[1] = RStack_230;
      local_130.bcr_p = local_2b0;
      local_130.orig_comp = orig_comp;
      local_130.geomdata.dx[2] = RVar1;
      local_130.geomdata.is_periodic[0] = uVar19;
      local_130.geomdata.is_periodic[1] = uVar16;
      local_130.geomdata.is_periodic[2] = uVar17;
      local_130.geomdata.coord = CVar5;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_5_>
                (&local_1b8,(anon_class_256_9_91658bbd *)&local_130);
      bVar11 = (geom->super_CoordSys).field_0x53;
    }
    if (((bVar11 & 1) == 0) && (iVar29 = (int)local_1d0, iVar29 < (bx->bigend).vect[2])) {
      local_1b8.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar6 = *(undefined8 *)(bx->bigend).vect;
      local_1b8._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      local_1b8.bigend.vect[0] = (int)uVar6;
      local_1b8.bigend.vect[1] = (int)((ulong)uVar6 >> 0x20);
      local_1b8.smallend.vect[2] = iVar29 + 1;
      local_130.dcomp = dcomp;
      local_130.numcomp = numcomp;
      local_130.fab.p = pdVar7;
      local_130.fab.jstride = lVar26;
      local_130.fab.kstride = lVar28;
      local_130.fab.nstride = lVar18;
      local_130.fab.begin._0_8_ = lVar23;
      local_130.fab.begin.z = iVar3;
      local_130.fab.end._0_8_ = lVar27;
      local_130.fab.end.z = iVar25;
      local_130.fab.ncomp = iVar2;
      local_130.dxhi = iVar29;
      local_130.f_user.lprobparm = local_228;
      local_130.f_user.lacparm._0_4_ = uStack_220;
      local_130.f_user.m_do_turbinflow = iStack_210;
      local_130.f_user.lpmfdata._4_4_ = uStack_214;
      local_130.f_user.lacparm._4_4_ = uStack_21c;
      local_130.f_user.lpmfdata._0_4_ = local_218;
      pRVar21 = &local_188;
      pGVar22 = &local_130.geomdata;
      for (lVar26 = 10; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pGVar22->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar30 * -2 + 1;
        pGVar22 = (GeometryData *)((long)pGVar22 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_130.geomdata.dx[0] = local_238;
      local_130.geomdata.dx[1] = RStack_230;
      local_130.bcr_p = local_2b0;
      local_130.orig_comp = orig_comp;
      local_130.geomdata.dx[2] = RVar1;
      local_130.geomdata.is_periodic[0] = uVar19;
      local_130.geomdata.is_periodic[1] = uVar16;
      local_130.geomdata.is_periodic[2] = uVar17;
      local_130.geomdata.coord = CVar5;
      local_130.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_6_>
                (&local_1b8,(anon_class_256_9_b38f8aff *)&local_130);
    }
    Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&local_198);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::nddoit (Box const& bx, FArrayBox& dest,
                            const int dcomp, const int numcomp,
                            Geometry const& geom, const Real time,
                            const Vector<BCRec>& bcr, const int bcomp,
                            const int orig_comp)
{
    const IntVect& len = bx.length();

    Box const& domain = amrex::convert(geom.Domain(),IntVect::TheNodeVector());
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // xlo
    if (!geom.isPeriodic(0) && bx.smallEnd(0) < domain.smallEnd(0)) {
        Box bndry = bx;
        int dxlo = domain.smallEnd(0);
        bndry.setBig(0,dxlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxlo,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // xhi
    if (!geom.isPeriodic(0) && bx.bigEnd(0) > domain.bigEnd(0)) {
        Box bndry = bx;
        int dxhi = domain.bigEnd(0);
        bndry.setSmall(0,dxhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxhi,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

#if (AMREX_SPACEDIM >= 2)
    // ylo
    if (!geom.isPeriodic(1) && bx.smallEnd(1) < domain.smallEnd(1)) {
        Box bndry = bx;
        int dylo = domain.smallEnd(1);
        bndry.setBig(1,dylo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dylo,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // yhi
    if (!geom.isPeriodic(1) && bx.bigEnd(1) > domain.bigEnd(1)) {
        Box bndry = bx;
        int dyhi = domain.bigEnd(1);
        bndry.setSmall(1,dyhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dyhi,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // zlo
    if (!geom.isPeriodic(2) && bx.smallEnd(2) < domain.smallEnd(2)) {
        Box bndry = bx;
        int dzlo = domain.smallEnd(2);
        bndry.setBig(2,dzlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzlo,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // zhi
    if (!geom.isPeriodic(2) && bx.bigEnd(2) > domain.bigEnd(2)) {
        Box bndry = bx;
        int dzhi = domain.bigEnd(2);
        bndry.setSmall(2,dzhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzhi,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif
}